

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-time.c
# Opt level: O3

int run_test_loop_backend_timeout(void)

{
  int iVar1;
  undefined8 uVar2;
  uv_timer_t timer;
  undefined1 local_a0 [152];
  
  uVar2 = uv_default_loop();
  iVar1 = uv_timer_init(uVar2,local_a0);
  if (iVar1 == 0) {
    iVar1 = uv_loop_alive(uVar2);
    if (iVar1 != 0) goto LAB_00163f47;
    iVar1 = uv_backend_timeout(uVar2);
    if (iVar1 != 0) goto LAB_00163f4c;
    iVar1 = uv_timer_start(local_a0,cb,1000,0);
    if (iVar1 != 0) goto LAB_00163f51;
    iVar1 = uv_backend_timeout(uVar2);
    if (iVar1 < 0x65) goto LAB_00163f56;
    iVar1 = uv_backend_timeout(uVar2);
    if (1000 < iVar1) goto LAB_00163f5b;
    iVar1 = uv_run(uVar2,0);
    if (iVar1 != 0) goto LAB_00163f60;
    iVar1 = uv_backend_timeout(uVar2);
    if (iVar1 == 0) {
      uVar2 = uv_default_loop();
      uv_walk(uVar2,close_walk_cb,0);
      uv_run(uVar2,0);
      uVar2 = uv_default_loop();
      iVar1 = uv_loop_close(uVar2);
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00163f6a;
    }
  }
  else {
    run_test_loop_backend_timeout_cold_1();
LAB_00163f47:
    run_test_loop_backend_timeout_cold_2();
LAB_00163f4c:
    run_test_loop_backend_timeout_cold_3();
LAB_00163f51:
    run_test_loop_backend_timeout_cold_4();
LAB_00163f56:
    run_test_loop_backend_timeout_cold_5();
LAB_00163f5b:
    run_test_loop_backend_timeout_cold_6();
LAB_00163f60:
    run_test_loop_backend_timeout_cold_7();
  }
  run_test_loop_backend_timeout_cold_8();
LAB_00163f6a:
  run_test_loop_backend_timeout_cold_9();
  iVar1 = uv_close();
  return iVar1;
}

Assistant:

TEST_IMPL(loop_backend_timeout) {
  uv_loop_t *loop = uv_default_loop();
  uv_timer_t timer;
  int r;

  r = uv_timer_init(loop, &timer);
  ASSERT(r == 0);

  ASSERT(!uv_loop_alive(loop));
  ASSERT(uv_backend_timeout(loop) == 0);

  r = uv_timer_start(&timer, cb, 1000, 0); /* 1 sec */
  ASSERT(r == 0);
  ASSERT(uv_backend_timeout(loop) > 100); /* 0.1 sec */
  ASSERT(uv_backend_timeout(loop) <= 1000); /* 1 sec */

  r = uv_run(loop, UV_RUN_DEFAULT);
  ASSERT(r == 0);
  ASSERT(uv_backend_timeout(loop) == 0);

  MAKE_VALGRIND_HAPPY();
  return 0;
}